

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DropTable(Parse *pParse,SrcList *pName,int isView,int noErr)

{
  sqlite3 *db;
  Schema *pSVar1;
  char *zArg3;
  VTable *pVVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  Table *pTable;
  VTable **ppVVar6;
  Vdbe *pVVar7;
  Schema **ppSVar8;
  long lVar9;
  char *pcVar10;
  uchar uVar11;
  uchar uVar12;
  
  db = pParse->db;
  if ((db->mallocFailed != '\0') || (iVar4 = sqlite3ReadSchema(pParse), iVar4 != 0))
  goto LAB_00165f6e;
  if (noErr == 0) {
    pTable = sqlite3LocateTableItem(pParse,isView,pName->a);
    if (pTable == (Table *)0x0) goto LAB_00165f6e;
  }
  else {
    db->suppressErr = db->suppressErr + '\x01';
    pTable = sqlite3LocateTableItem(pParse,isView,pName->a);
    db->suppressErr = db->suppressErr + 0xff;
    if (pTable == (Table *)0x0) {
      sqlite3CodeVerifyNamedSchema(pParse,pName->a[0].u4.zDatabase);
      sqlite3ForceNotReadOnly(pParse);
      goto LAB_00165f6e;
    }
  }
  if (pTable->pSchema == (Schema *)0x0) {
    iVar4 = -0x8000;
  }
  else {
    iVar4 = -1;
    ppSVar8 = &db->aDb->pSchema;
    do {
      iVar4 = iVar4 + 1;
      pSVar1 = *ppSVar8;
      ppSVar8 = ppSVar8 + 4;
    } while (pSVar1 != pTable->pSchema);
  }
  if ((pTable->eTabType == '\x01') && (iVar5 = viewGetColumnNames(pParse,pTable), iVar5 != 0))
  goto LAB_00165f6e;
  pcVar10 = "sqlite_master";
  if (iVar4 == 1) {
    pcVar10 = "sqlite_temp_master";
  }
  zArg3 = db->aDb[iVar4].zDbSName;
  iVar5 = sqlite3AuthCheck(pParse,9,pcVar10,(char *)0x0,zArg3);
  if (iVar5 != 0) goto LAB_00165f6e;
  if (isView == 0) {
    if (pTable->eTabType != '\x01') {
      iVar5 = (uint)(iVar4 == 1) * 2 + 0xb;
      goto LAB_001660a9;
    }
    ppVVar6 = &(pTable->u).vtab.p;
    do {
      pVVar2 = *ppVVar6;
      ppVVar6 = &pVVar2->pNext;
    } while (pVVar2->db != db);
    pcVar10 = pVVar2->pMod->zName;
    iVar5 = 0x1e;
  }
  else {
    iVar5 = (uint)(iVar4 != 1) * 2 + 0xf;
LAB_001660a9:
    pcVar10 = (char *)0x0;
  }
  iVar5 = sqlite3AuthCheck(pParse,iVar5,pTable->zName,pcVar10,zArg3);
  if ((iVar5 != 0) ||
     (iVar5 = sqlite3AuthCheck(pParse,9,pTable->zName,(char *)0x0,zArg3), iVar5 != 0))
  goto LAB_00165f6e;
  pcVar10 = pTable->zName;
  if (pcVar10 == (char *)0x0) {
LAB_00166169:
    sVar3 = (short)pTable->tabFlags;
    if (((((pTable->tabFlags >> 0xc & 1) == 0) || ((db->flags & 0x10000000) == 0)) ||
        (db->pVtabCtx != (VtabCtx *)0x0)) || (db->nVdbeExec != 0)) {
      if (sVar3 < 0) goto LAB_00166197;
      goto LAB_001661f4;
    }
    if (((0 < db->nVTrans) && (-1 < sVar3)) && (db->aVTrans == (VTable **)0x0)) goto LAB_001661f4;
LAB_00166197:
    pcVar10 = "table %s may not be dropped";
  }
  else {
    lVar9 = 0;
    do {
      if ((ulong)(byte)pcVar10[lVar9] == 0) {
        uVar12 = ""[(byte)"sqlite_"[lVar9]];
        uVar11 = '\0';
LAB_0016612e:
        if (uVar11 != uVar12) goto LAB_00166169;
        break;
      }
      uVar11 = ""[(byte)pcVar10[lVar9]];
      uVar12 = ""[(byte)"sqlite_"[lVar9]];
      if (uVar11 != uVar12) goto LAB_0016612e;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 7);
    lVar9 = 0;
    do {
      if ((ulong)(byte)pcVar10[lVar9 + 7] == 0) {
        uVar12 = ""[(byte)"tbl,idx,stat"[lVar9 + 8]];
        uVar11 = '\0';
LAB_001661aa:
        if (uVar11 != uVar12) {
          lVar9 = 0;
          goto LAB_001661bb;
        }
        break;
      }
      uVar11 = ""[(byte)pcVar10[lVar9 + 7]];
      uVar12 = ""[(byte)"tbl,idx,stat"[lVar9 + 8]];
      if (uVar11 != uVar12) goto LAB_001661aa;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
LAB_001661f4:
    if (isView == 0) {
      if (pTable->eTabType != '\x02') goto LAB_00166223;
      pcVar10 = "use DROP VIEW to delete view %s";
    }
    else {
      if (pTable->eTabType == '\x02') {
LAB_00166223:
        pVVar7 = sqlite3GetVdbe(pParse);
        if (pVVar7 != (Vdbe *)0x0) {
          sqlite3BeginWriteOperation(pParse,1,iVar4);
          if (isView == 0) {
            sqlite3ClearStatTables(pParse,iVar4,"tbl",pTable->zName);
            sqlite3FkDropTable(pParse,pName,pTable);
          }
          sqlite3CodeDropTable(pParse,pTable,iVar4,(uint)(isView != 0));
        }
        goto LAB_00165f6e;
      }
      pcVar10 = "use DROP TABLE to delete table %s";
    }
  }
  sqlite3ErrorMsg(pParse,pcVar10);
LAB_00165f6e:
  sqlite3SrcListDelete(db,pName);
  return;
  while( true ) {
    uVar11 = ""[(byte)pcVar10[lVar9 + 7]];
    uVar12 = ""[(byte)"Unable to bind parameters"[lVar9 + 0xf]];
    if (uVar11 != uVar12) goto LAB_001661ec;
    lVar9 = lVar9 + 1;
    if (lVar9 == 10) break;
LAB_001661bb:
    if ((ulong)(byte)pcVar10[lVar9 + 7] == 0) {
      uVar12 = ""[(byte)"Unable to bind parameters"[lVar9 + 0xf]];
      uVar11 = '\0';
LAB_001661ec:
      if (uVar11 != uVar12) goto LAB_00166197;
      break;
    }
  }
  goto LAB_001661f4;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTable(Parse *pParse, SrcList *pName, int isView, int noErr){
  Table *pTab;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  if( db->mallocFailed ){
    goto exit_drop_table;
  }
  assert( pParse->nErr==0 );
  assert( pName->nSrc==1 );
  assert( pName->a[0].fg.fixedSchema==0 );
  assert( pName->a[0].fg.isSubquery==0 );
  if( sqlite3ReadSchema(pParse) ) goto exit_drop_table;
  if( noErr ) db->suppressErr++;
  assert( isView==0 || isView==LOCATE_VIEW );
  pTab = sqlite3LocateTableItem(pParse, isView, &pName->a[0]);
  if( noErr ) db->suppressErr--;

  if( pTab==0 ){
    if( noErr ){
      sqlite3CodeVerifyNamedSchema(pParse, pName->a[0].u4.zDatabase);
      sqlite3ForceNotReadOnly(pParse);
    }
    goto exit_drop_table;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 && iDb<db->nDb );

  /* If pTab is a virtual table, call ViewGetColumnNames() to ensure
  ** it is initialized.
  */
  if( IsVirtual(pTab) && sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_drop_table;
  }
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code;
    const char *zTab = SCHEMA_TABLE(iDb);
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zArg2 = 0;
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb)){
      goto exit_drop_table;
    }
    if( isView ){
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_VIEW;
      }else{
        code = SQLITE_DROP_VIEW;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    }else if( IsVirtual(pTab) ){
      code = SQLITE_DROP_VTABLE;
      zArg2 = sqlite3GetVTable(db, pTab)->pMod->zName;
#endif
    }else{
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_TABLE;
      }else{
        code = SQLITE_DROP_TABLE;
      }
    }
    if( sqlite3AuthCheck(pParse, code, pTab->zName, zArg2, zDb) ){
      goto exit_drop_table;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0, zDb) ){
      goto exit_drop_table;
    }
  }
#endif
  if( tableMayNotBeDropped(db, pTab) ){
    sqlite3ErrorMsg(pParse, "table %s may not be dropped", pTab->zName);
    goto exit_drop_table;
  }

#ifndef SQLITE_OMIT_VIEW
  /* Ensure DROP TABLE is not used on a view, and DROP VIEW is not used
  ** on a table.
  */
  if( isView && !IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "use DROP TABLE to delete table %s", pTab->zName);
    goto exit_drop_table;
  }
  if( !isView && IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "use DROP VIEW to delete view %s", pTab->zName);
    goto exit_drop_table;
  }
#endif

  /* Generate code to remove the table from the schema table
  ** on disk.
  */
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    if( !isView ){
      sqlite3ClearStatTables(pParse, iDb, "tbl", pTab->zName);
      sqlite3FkDropTable(pParse, pName, pTab);
    }
    sqlite3CodeDropTable(pParse, pTab, iDb, isView);
  }

exit_drop_table:
  sqlite3SrcListDelete(db, pName);
}